

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool __thiscall
libcellml::Importer::ImporterImpl::checkForImportCycles
          (ImporterImpl *this,ImportSourcePtr *importSource,History *history,HistoryEpochPtr *h,
          string *action)

{
  bool bVar1;
  IssuePtr issue;
  History cyclicHistory;
  string description;
  
  bVar1 = libcellml::checkForImportCycles(history,h);
  if (bVar1) {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::vector(&cyclicHistory,history);
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back(&cyclicHistory,h);
    formDescriptionOfCyclicDependency(&description,&cyclicHistory,action);
    Issue::IssueImpl::create();
    Issue::IssueImpl::setDescription
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,&description);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_EQUIVALENT_INFOSET);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&description);
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::~vector(&cyclicHistory);
  }
  return bVar1;
}

Assistant:

bool Importer::ImporterImpl::checkForImportCycles(const ImportSourcePtr &importSource, const History &history, const HistoryEpochPtr &h, const std::string &action)
{
    if (libcellml::checkForImportCycles(history, h)) {
        auto cyclicHistory = history;
        cyclicHistory.push_back(h);
        auto description = formDescriptionOfCyclicDependency(cyclicHistory, action);
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription(description);
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_EQUIVALENT_INFOSET);
        addIssue(issue);
        return true;
    }

    return false;
}